

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O2

int __thiscall QFontEngineFT::glyphCount(QFontEngineFT *this)

{
  FT_Face_conflict pFVar1;
  int iVar2;
  
  iVar2 = 0;
  pFVar1 = lockFace(this,Scaled);
  if (pFVar1 != (FT_Face_conflict)0x0) {
    iVar2 = (int)pFVar1->num_glyphs;
    unlockFace(this);
  }
  return iVar2;
}

Assistant:

int QFontEngineFT::glyphCount() const
{
    int count = 0;
    FT_Face face = lockFace();
    if (face) {
        count = face->num_glyphs;
        unlockFace();
    }
    return count;
}